

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.cpp
# Opt level: O3

vm_obj_id_t CVmObjTads::create_from_stack_multi(uint argc,int is_transient)

{
  ushort uVar1;
  vm_datatype_t *pvVar2;
  vm_val_t *pvVar3;
  vm_obj_id_t obj_id;
  int iVar4;
  CVmObjTads *self;
  vm_tadsobj_hdr *pvVar5;
  ulong uVar6;
  char *lst;
  ushort *lst_00;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  vm_val_t *this;
  vm_val_t new_obj_val;
  vm_rcdesc rc;
  vm_val_t sc_1;
  vm_val_t local_98;
  undefined1 local_88 [16];
  char *local_78;
  vm_datatype_t local_70;
  vm_datatype_t local_60;
  unsigned_short local_50;
  uchar *local_48;
  vm_val_t local_40;
  
  obj_id = CVmObjTable::alloc_obj(&G_obj_table_X,0,1,0);
  if (is_transient != 0) {
    *(ushort *)&G_obj_table_X.pages_[obj_id >> 0xc][obj_id & 0xfff].field_0x14 =
         *(ushort *)&G_obj_table_X.pages_[obj_id >> 0xc][obj_id & 0xfff].field_0x14 | 0x80;
  }
  self = (CVmObjTads *)CVmObject::operator_new(0x10,obj_id);
  (self->super_CVmObject)._vptr_CVmObject = (_func_int **)&PTR_get_metaclass_reg_00369550;
  pvVar5 = vm_tadsobj_hdr::alloc(self,(unsigned_short)argc,0x10);
  (self->super_CVmObject).ext_ = (char *)pvVar5;
  pvVar3 = sp_;
  pvVar2 = &sp_->typ;
  sp_ = sp_ + 1;
  *pvVar2 = VM_OBJ;
  (pvVar3->val).obj = obj_id;
  if (argc != 0) {
    uVar6 = 0;
    uVar8 = 1;
    do {
      pvVar3 = sp_;
      this = sp_ + (-2 - uVar6);
      lst = vm_val_t::get_as_list(this);
      if (lst == (char *)0x0) {
        local_88._0_8_ = *(undefined8 *)this;
        local_88._8_4_ = pvVar3[-2 - uVar6].val.obj;
        local_88._12_4_ = *(undefined4 *)((long)&pvVar3[-2 - uVar6].val + 4);
      }
      else {
        CVmObjList::index_list((vm_val_t *)local_88,lst,1);
      }
      if (local_88._0_4_ != VM_OBJ) {
LAB_002bc8a5:
        err_throw(0x900);
      }
      iVar4 = (**(code **)(*(long *)&G_obj_table_X.pages_[(uint)local_88._8_4_ >> 0xc]
                                     [local_88._8_4_ & 0xfff].ptr_ + 8))
                        (G_obj_table_X.pages_[(uint)local_88._8_4_ >> 0xc] +
                         (local_88._8_4_ & 0xfff),metaclass_reg_);
      if (iVar4 == 0) goto LAB_002bc8a5;
      if (local_88._8_4_ == 0) {
        uVar7 = 0;
        uVar6 = 0;
      }
      else {
        uVar6 = (ulong)((uint)local_88._8_4_ >> 0xc);
        uVar7 = local_88._8_4_ & 0xfff;
        if ((G_obj_table_X.pages_[uVar6][uVar7].field_0x14 & 0x80) != 0) {
          err_throw(0x7e1);
        }
      }
      uVar9 = (ulong)((uVar8 - 1 & 0xffff) << 4);
      *(undefined4 *)((self->super_CVmObject).ext_ + uVar9 + 0x28) = local_88._8_4_;
      *(char **)((self->super_CVmObject).ext_ + uVar9 + 0x30) =
           (G_obj_table_X.pages_[uVar6]->ptr_).obj_ + uVar7 * 0x18;
      uVar7 = uVar8 & 0xffff;
      uVar6 = (ulong)uVar7;
      uVar8 = uVar8 + 1;
    } while (uVar7 < argc);
  }
  uVar6 = 0;
  local_78 = "TadsObject.contructMulti";
  local_70 = VM_NIL;
  local_60 = VM_NIL;
  local_50 = 0;
  local_88._8_4_ = 0;
  local_88._0_8_ = (vm_val_t *)0x0;
  local_48 = (uchar *)0x0;
  if (argc != 0) {
    uVar8 = 0;
    do {
      lst_00 = (ushort *)vm_val_t::get_as_list(sp_ + (-2 - uVar6));
      if (lst_00 != (ushort *)0x0) {
        CVmObjList::index_list(&local_40,(char *)lst_00,1);
        uVar1 = *lst_00;
        if (G_interpreter_X.super_CVmStack.max_depth_ <
            (((long)sp_ - (long)G_interpreter_X.super_CVmStack.arr_ >> 4) + (ulong)uVar1) - 1) {
          err_throw(0x8ff);
        }
        uVar7 = (uint)uVar1;
        if (1 < uVar1) {
          do {
            pvVar3 = sp_;
            sp_ = sp_ + 1;
            CVmObjList::index_list(pvVar3,(char *)lst_00,uVar7);
            uVar7 = uVar7 - 1;
          } while (1 < uVar7);
        }
        local_98.typ = VM_OBJ;
        local_98.val.obj = obj_id;
        CVmRun::get_prop(&G_interpreter_X,0,&local_40,G_predef_X.obj_construct,&local_98,uVar1 - 1,
                         (vm_rcdesc *)local_88);
      }
      uVar8 = uVar8 + 1;
      uVar6 = (ulong)(uVar8 & 0xffff);
    } while ((uVar8 & 0xffff) < argc);
  }
  sp_ = sp_ + (-1 - (ulong)argc);
  return obj_id;
}

Assistant:

vm_obj_id_t CVmObjTads::create_from_stack_multi(
    VMG_ uint argc, int is_transient)
{
    /* allocate an object ID */
    vm_obj_id_t id = vm_new_id(vmg_ FALSE, TRUE, FALSE);
    if (is_transient)
        G_obj_table->set_obj_transient(id);

    /* create the new object */
    CVmObjTads *obj = new (vmg_ id) CVmObjTads(
        vmg_ (ushort)argc, VMTOBJ_PROP_INIT);

    /* push the new object, for garbage collector protection */
    G_interpreter->push_obj(vmg_ id);

    /* set the superclasses */
    for (ushort i = 0 ; i < argc ; ++i)
    {
        /* 
         *   get this argument (it's at i+1 because of the extra item we
         *   pushed for gc protection) 
         */
        vm_val_t *arg = G_stk->get(i + 1);

        /* 
         *   if it's a list, the superclass is the first element; otherwise,
         *   the argument is the superclass 
         */
        vm_val_t sc;
        const char *lstp = arg->get_as_list(vmg0_);
        if (lstp != 0)
        {
            /* it's a list - the first element is the superclass */
            CVmObjList::index_list(vmg_ &sc, lstp, 1);
        }
        else
        {
            /* not a list - the argument is the superclass */
            sc = *arg;
        }

        /* make sure it's a TadsObject */
        if (sc.typ != VM_OBJ || !is_tadsobj_obj(vmg_ sc.val.obj))
            err_throw(VMERR_BAD_TYPE_BIF);

        /* can't create an instance of a transient object */
        if (G_obj_table->is_obj_transient(sc.val.obj))
            err_throw(VMERR_BAD_DYNAMIC_NEW);

        /* set this superclass */
        obj->set_sc(vmg_ i, sc.val.obj);
    }

    /* set up the resursive invocation context */
    vm_rcdesc rc("TadsObject.contructMulti");

    /*
     *   The new object is ready to go.  All that remains is invoking any
     *   inherited construtors that the caller wants us to invoked.
     *   Constructor invocation is indicated by passing a list argument for
     *   the corresponding superclass, so run through the arguments and
     *   invoke each indicated constructor.  
     */
    for (ushort i = 0 ; i < argc ; ++i)
    {    
        /* get the next argument */
        vm_val_t *arg = G_stk->get(i + 1);

        /* if it's not a list, we don't want to invoke this constructor */
        const char *lstp = arg->get_as_list(vmg0_);
        if (lstp == 0)
        {
            /* no constructor call is wanted - just keep going */
            continue;
        }

        /* get the superclass from the list */
        vm_val_t sc;
        CVmObjList::index_list(vmg_ &sc, lstp, 1);

        /* get the number of list elements */
        uint lst_cnt = vmb_get_len(lstp);

        /* make sure we have room to push the arguments */
        if (!G_stk->check_space(lst_cnt - 1))
            err_throw(VMERR_STACK_OVERFLOW);

        /* 
         *   push the list elements in reverse order; don't push the first
         *   element, since it's the superclass itself rather than an
         *   argument to the constructor 
         */
        for (uint j = lst_cnt ; j > 1 ; --j)
            CVmObjList::index_and_push(vmg_ lstp, j);

        /* 
         *   Invoke the constructor via a recursive call into the VM.  Note
         *   that we're inheriting the property, so 'self' is the new object,
         *   but the 'target' object is the superclass whose constructor
         *   we're invoking. 
         */
        vm_val_t new_obj_val;
        new_obj_val.set_obj(id);
        G_interpreter->get_prop(vmg_ 0, &sc, G_predef->obj_construct,
                                &new_obj_val, lst_cnt - 1, &rc);
    }

    /* discard the arguments plus our own gc protection */
    G_stk->discard(argc + 1);

    /* return the new object */
    return id;
}